

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

int __thiscall CVmConsole::set_obey_whitespace(CVmConsole *this,int f)

{
  ushort uVar1;
  
  uVar1 = *(ushort *)&this->disp_str_->field_0xef81;
  *(ushort *)&this->disp_str_->field_0xef81 = uVar1 & 0xfffe | (ushort)(f != 0);
  if ((this->field_0x18 & 1) != 0) {
    *(ushort *)&(this->log_str_->super_CVmFormatter).field_0xef81 =
         (ushort)(f != 0) | *(ushort *)&(this->log_str_->super_CVmFormatter).field_0xef81 & 0xfffe;
  }
  return uVar1 & 1;
}

Assistant:

int CVmConsole::set_obey_whitespace(int f)
{
    int ret;

    /* note the original display stream status */
    ret = disp_str_->get_obey_whitespace();

    /* set the stream status */
    disp_str_->set_obey_whitespace(f);
    if (log_enabled_)
        log_str_->set_obey_whitespace(f);

    /* return the original status of the display stream */
    return ret;
}